

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialRigidBodyInertia * __thiscall
RigidBodyDynamics::Math::SpatialTransform::applyTranspose
          (SpatialTransform *this,SpatialRigidBodyInertia *rbi)

{
  undefined8 *in_RDX;
  SpatialRigidBodyInertia *in_RDI;
  Vector3d E_T_mr;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffc58;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_fffffffffffffc60;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other_00;
  SpatialRigidBodyInertia *this_01;
  SpatialRigidBodyInertia *other_01;
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *in_stack_fffffffffffffc88;
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *this_02;
  StorageBaseType *in_stack_fffffffffffffca0;
  double *in_stack_fffffffffffffca8;
  Vector3d *in_stack_fffffffffffffcc0;
  double *in_stack_fffffffffffffcc8;
  double *in_stack_fffffffffffffcd0;
  double *in_stack_fffffffffffffcd8;
  double *in_stack_fffffffffffffce0;
  double *in_stack_fffffffffffffce8;
  Matrix3_t *in_stack_fffffffffffffcf0;
  double *in_stack_fffffffffffffd00;
  double *in_stack_fffffffffffffd08;
  double *in_stack_fffffffffffffd10;
  double *in_stack_fffffffffffffd18;
  
  other_01 = in_RDI;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose(in_stack_fffffffffffffc58);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
            (in_stack_fffffffffffffc60,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffc58);
  Eigen::operator*(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator+(in_stack_fffffffffffffc88,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)other_01);
  Vector3_t::
  Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Vector3_t *)in_stack_fffffffffffffc60,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffc58);
  this_02 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
             *)*in_RDX;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose(in_stack_fffffffffffffc58);
  other = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)(in_RDX + 8);
  this_00 = (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)(in_RDX + 7);
  other_00 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)(in_RDX + 8);
  this_01 = (SpatialRigidBodyInertia *)(in_RDX + 9);
  Matrix3_t::Matrix3_t
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
             in_stack_fffffffffffffd00,in_stack_fffffffffffffd08,in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd18);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*(this_00,other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,other_00);
  VectorCrossMatrix(in_stack_fffffffffffffcc0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
            (this_00,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
  Vector3_t::
  Vector3_t<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Vector3_t *)this_00,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)other);
  VectorCrossMatrix(in_stack_fffffffffffffcc0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,other);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator-(this_02,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                       *)other_01);
  VectorCrossMatrix(in_stack_fffffffffffffcc0);
  VectorCrossMatrix(in_stack_fffffffffffffcc0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,other);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>>
  ::operator-((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>_>
               *)this_02,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)other_01);
  Matrix3_t::
  Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>>
            ((Matrix3_t *)this_00,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>_>
              *)other);
  SpatialRigidBodyInertia::SpatialRigidBodyInertia
            (this_01,(double)other_00,(Vector3d *)this_00,(Matrix3d *)other);
  return in_RDI;
}

Assistant:

SpatialRigidBodyInertia applyTranspose (const SpatialRigidBodyInertia &rbi) {
		Vector3d E_T_mr = E.transpose() * rbi.h + rbi.m * r;
		return SpatialRigidBodyInertia (
				rbi.m,
				E_T_mr,
				E.transpose() * 
					 	Matrix3d (
							rbi.Ixx, rbi.Iyx, rbi.Izx,
							rbi.Iyx, rbi.Iyy, rbi.Izy,
							rbi.Izx, rbi.Izy, rbi.Izz
							) * E
					- VectorCrossMatrix(r) * VectorCrossMatrix (E.transpose() * rbi.h)  
					- VectorCrossMatrix (E_T_mr) * VectorCrossMatrix (r));
	}